

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_prefix(FuncState *fs,UnOpr op,expdesc *e)

{
  int iVar1;
  undefined1 local_38 [8];
  expdesc e2;
  expdesc *e_local;
  UnOpr op_local;
  FuncState *fs_local;
  
  e2.u.s.aux = -1;
  e2.u.s.info = -1;
  local_38._0_4_ = VKNUM;
  e2.k = VVOID;
  e2._4_4_ = 0;
  e2._16_8_ = e;
  if (op == OPR_MINUS) {
    iVar1 = isnumeral(e);
    if (iVar1 == 0) {
      luaK_exp2anyreg(fs,(expdesc *)e2._16_8_);
    }
    codearith(fs,OP_UNM,(expdesc *)e2._16_8_,(expdesc *)local_38);
  }
  else if (op == OPR_NOT) {
    codenot(fs,e);
  }
  else if (op == OPR_LEN) {
    luaK_exp2anyreg(fs,e);
    codearith(fs,OP_LEN,(expdesc *)e2._16_8_,(expdesc *)local_38);
  }
  return;
}

Assistant:

void luaK_prefix (FuncState *fs, UnOpr op, expdesc *e) {
  expdesc e2;
  e2.t = e2.f = NO_JUMP; e2.k = VKNUM; e2.u.nval = 0;
  switch (op) {
    case OPR_MINUS: {
      if (!isnumeral(e))
        luaK_exp2anyreg(fs, e);  /* cannot operate on non-numeric constants */
      codearith(fs, OP_UNM, e, &e2);
      break;
    }
    case OPR_NOT: codenot(fs, e); break;
    case OPR_LEN: {
      luaK_exp2anyreg(fs, e);  /* cannot operate on constants */
      codearith(fs, OP_LEN, e, &e2);
      break;
    }
    default: lua_assert(0);
  }
}